

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O3

bool Is11SectorTrack(Track *track)

{
  Sector *pSVar1;
  bool bVar2;
  int iVar3;
  Sector *s;
  Sector *this;
  
  iVar3 = Track::size(track);
  if (iVar3 == 0xb) {
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                super__Vector_impl_data._M_start; this != pSVar1; this = this + 1) {
      if (this->datarate != _250K) {
        return false;
      }
      if (this->encoding != MFM) {
        return false;
      }
      iVar3 = Sector::size(this);
      if ((iVar3 != 0x200) || (bVar2 = Sector::has_good_data(this), !bVar2)) goto LAB_0016ea87;
    }
    bVar2 = true;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [32])"detected 11-sector tight track\n");
    }
  }
  else {
LAB_0016ea87:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Is11SectorTrack(const Track& track)
{
    if (track.size() != 11)
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.size() != 512 || !s.has_good_data())
        {
            return false;
        }
    }

    if (opt.debug) util::cout << "detected 11-sector tight track\n";
    return true;
}